

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satTruth.c
# Opt level: O1

int * Tru_ManLookup(Tru_Man_t *p,word *pTruth)

{
  int *piVar1;
  uint uVar2;
  Vec_Set_t *pVVar3;
  uint uVar4;
  int *piVar5;
  word *pwVar6;
  ulong uVar7;
  word *pwVar8;
  
  if ((*pTruth & 1) != 0) {
    __assert_fail("(pTruth[0] & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satTruth.c"
                  ,0x62,"int *Tru_ManLookup(Tru_Man_t *, word *)");
  }
  uVar2 = p->nWords;
  if ((int)uVar2 < 1) {
    uVar4 = 0;
  }
  else {
    uVar7 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 ^ Tru_ManLookup::s_Primes[(uint)uVar7 & 7] * (int)pTruth[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  pwVar8 = (word *)0x0;
  uVar7 = (ulong)uVar4 % (ulong)(uint)p->nTableSize;
  uVar4 = p->pTable[uVar7];
  if (uVar4 != 0) {
    pVVar3 = p->pMem;
    pwVar8 = pVVar3->pPages[(int)uVar4 >> ((byte)pVVar3->nPageSize & 0x1f)] +
             (int)(pVVar3->uPageMask & uVar4);
  }
  piVar1 = p->pTable + uVar7;
  piVar5 = piVar1;
  if (pwVar8 != (word *)0x0) {
    while (0 < (int)uVar2) {
      uVar7 = 0;
      while (pwVar8[uVar7 + 1] == pTruth[uVar7]) {
        uVar7 = uVar7 + 1;
        if (uVar2 == uVar7) {
          return piVar5;
        }
      }
      uVar4 = *(uint *)((long)pwVar8 + 4);
      if (uVar4 == 0) {
        pwVar6 = (word *)0x0;
      }
      else {
        pVVar3 = p->pMem;
        pwVar6 = pVVar3->pPages[(int)uVar4 >> ((byte)pVVar3->nPageSize & 0x1f)] +
                 (int)(pVVar3->uPageMask & uVar4);
      }
      piVar5 = (int *)((long)pwVar8 + 4);
      pwVar8 = pwVar6;
      if (pwVar6 == (word *)0x0) {
        return piVar5;
      }
    }
  }
  return piVar1;
}

Assistant:

int * Tru_ManLookup( Tru_Man_t * p, word * pTruth )
{
    static int s_Primes[10] = { 1291, 1699, 2357, 4177, 5147, 5647, 6343, 7103, 7873, 8147 };
    Tru_One_t * pEntry;
    int * pSpot;
    assert( (pTruth[0] & 1) == 0 );
    pSpot = p->pTable + Tru_ManHash( pTruth, p->nWords, p->nTableSize, s_Primes );
    for ( pEntry = Tru_ManReadOne(p, *pSpot); pEntry; pSpot = &pEntry->Next, pEntry = Tru_ManReadOne(p, *pSpot) )
        if ( Tru_ManEqual(pEntry->pTruth, pTruth, p->nWords) )
            return pSpot;
    return pSpot;
}